

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O2

bool double_conversion::(anonymous_namespace)::ConsumeSubString<char_const*>
               (char **current,char *end,char *substring,bool allow_case_insensitivity)

{
  bool bVar1;
  code *converter;
  undefined7 in_register_00000009;
  
  converter = anon_unknown_0::Pass;
  if ((int)CONCAT71(in_register_00000009,allow_case_insensitivity) != 0) {
    converter = anon_unknown_0::ToLower;
  }
  bVar1 = ConsumeSubStringImpl<char_const*,char(*)(char)>(current,end,substring,converter);
  return bVar1;
}

Assistant:

static bool ConsumeSubString(Iterator* current,
                             Iterator end,
                             const char* substring,
                             bool allow_case_insensitivity) {
  if (allow_case_insensitivity) {
    return ConsumeSubStringImpl(current, end, substring, ToLower);
  } else {
    return ConsumeSubStringImpl(current, end, substring, Pass);
  }
}